

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_perform_helo(connectdata *conn)

{
  CURLcode CVar1;
  smtp_conn *smtpc;
  CURLcode result;
  connectdata *conn_local;
  
  (conn->proto).imapc.cmdid = 0;
  CVar1 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"HELO %s",(conn->proto).ftpc.dirs);
  if (CVar1 == CURLE_OK) {
    state(conn,SMTP_HELO);
  }
  return CVar1;
}

Assistant:

static CURLcode smtp_perform_helo(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct smtp_conn *smtpc = &conn->proto.smtpc;

  smtpc->authused = 0;          /* No authentication mechanism used in smtp
                                   connections */

  /* Send the HELO command */
  result = Curl_pp_sendf(&smtpc->pp, "HELO %s", smtpc->domain);

  if(!result)
    state(conn, SMTP_HELO);

  return result;
}